

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O3

void Cut_CellSuppMin(Cut_Cell_t *pCell)

{
  ushort *puVar1;
  bool bVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint *pIn;
  uint nVars;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  uint *pOut;
  
  uVar10 = *(uint *)&pCell->field_0x20 & 0xf;
  if (uVar10 != 0) {
    pcVar9 = pCell->CanonPerm + (ulong)(uVar10 - 1) + 1;
    do {
      iVar4 = Extra_TruthVarInSupport(pCell->uTruth,*(uint *)&pCell->field_0x20 & 0xf,uVar10 - 1);
      if (iVar4 == 0) {
        uVar5 = *(uint *)&pCell->field_0x20;
        nVars = uVar5 & 0xf;
        if (uVar10 < nVars) {
          puVar3 = pCell->uTruth;
          pcVar11 = pcVar9;
          pIn = Cut_CellSuppMin::uTemp;
          uVar7 = 0xffffffff;
          do {
            pOut = pIn;
            pIn = puVar3;
            Extra_TruthSwapAdjacentVars(pOut,pIn,nVars,uVar10 + uVar7);
            puVar1 = (ushort *)(pcVar11 + -1);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            uVar5 = *(uint *)&pCell->field_0x20;
            nVars = uVar5 & 0xf;
            pcVar11 = pcVar11 + 1;
            uVar8 = uVar7 + 1;
            iVar4 = uVar7 + uVar10;
            puVar3 = pOut;
            uVar7 = uVar8;
          } while (iVar4 + 1 < (int)(nVars - 1));
          if ((uVar8 & 1) == 0) {
            uVar6 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
            if (nVars < 6) {
              uVar6 = 1;
            }
            uVar6 = uVar6 + 1;
            do {
              pIn[uVar6 - 2] = pOut[uVar6 - 2];
              uVar6 = uVar6 - 1;
            } while (1 < uVar6);
            uVar5 = *(uint *)&pCell->field_0x20;
          }
        }
        *(uint *)&pCell->field_0x20 = uVar5 & 0xfffffff0 | uVar5 - 1 & 0xf;
      }
      pcVar9 = pcVar9 + -1;
      bVar2 = 1 < (int)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void Cut_CellSuppMin( Cut_Cell_t * pCell )
{
    static unsigned uTemp[1<<(CUT_CELL_MVAR-5)];
    unsigned * pIn, * pOut, * pTemp;
    int i, k, Counter, Temp;

    // go backward through the support variables and remove redundant
    for ( k = pCell->nVars - 1; k >= 0; k-- )
        if ( !Extra_TruthVarInSupport(pCell->uTruth, pCell->nVars, k) )
        {
            // shift all the variables above this one
            Counter = 0;
            pIn = pCell->uTruth; pOut = uTemp;
            for ( i = k; i < (int)pCell->nVars - 1; i++ )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, pCell->nVars, i );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                // swap the support vars
                Temp = pCell->CanonPerm[i]; 
                pCell->CanonPerm[i] = pCell->CanonPerm[i+1];
                pCell->CanonPerm[i+1] = Temp;
                Counter++;
            }
            // return the function back into its place
            if ( Counter & 1 )
                Extra_TruthCopy( pOut, pIn, pCell->nVars );
            // remove one variable
            pCell->nVars--;
//            Extra_PrintBinary( stdout, pCell->uTruth, (1<<pCell->nVars) ); printf( "\n" );
        }
}